

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O1

int __thiscall gmath::SturmChain<double>::countSignChangesNegInf(SturmChain<double> *this)

{
  Polynomial<double> *pPVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  iVar2 = 0;
  if (1 < (long)this->n) {
    pPVar1 = this->f;
    dVar5 = pPVar1->c[(long)pPVar1->used + -1];
    if (((long)pPVar1->used - 1U & 1) != 0) {
      dVar5 = -dVar5;
    }
    lVar3 = 0;
    iVar2 = 0;
    do {
      lVar4 = (long)*(int *)((long)&pPVar1[1].used + lVar3);
      dVar6 = *(double *)(*(long *)((long)&pPVar1[1].c + lVar3) + -8 + lVar4 * 8);
      if ((lVar4 - 1U & 1) != 0) {
        dVar6 = -dVar6;
      }
      if (((dVar5 < 0.0) && (0.0 <= dVar6)) || ((0.0 <= dVar5 && (dVar6 < 0.0)))) {
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + 0x10;
      dVar5 = dVar6;
    } while ((long)this->n * 0x10 + -0x10 != lVar3);
  }
  return iVar2;
}

Assistant:

int countSignChangesNegInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient, multiplied by -1 if the degree
      // is odd has the same sign as the limes at negative infinity

      f1=f[0][f[0].getDegree()];

      if ((f[0].getDegree() & 0x1) != 0)
      {
        f1*=-1;
      }

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f[k].getDegree() & 0x1) != 0)
        {
          f2*=-1;
        }

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }